

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zeImageGetMemoryPropertiesExp
          (ze_image_handle_t hImage,ze_image_memory_properties_exp_t *pMemoryProperties)

{
  ze_pfnImageGetMemoryPropertiesExp_t pfnGetMemoryPropertiesExp;
  dditable_t *dditable;
  ze_result_t result;
  ze_image_memory_properties_exp_t *pMemoryProperties_local;
  ze_image_handle_t hImage_local;
  
  if (*(code **)(*(long *)(hImage + 8) + 0x398) == (code *)0x0) {
    hImage_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hImage_local._4_4_ =
         (**(code **)(*(long *)(hImage + 8) + 0x398))(*(undefined8 *)hImage,pMemoryProperties);
  }
  return hImage_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeImageGetMemoryPropertiesExp(
        ze_image_handle_t hImage,                       ///< [in] handle of image object
        ze_image_memory_properties_exp_t* pMemoryProperties ///< [in,out] query result for image memory properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_image_object_t*>( hImage )->dditable;
        auto pfnGetMemoryPropertiesExp = dditable->ze.ImageExp.pfnGetMemoryPropertiesExp;
        if( nullptr == pfnGetMemoryPropertiesExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hImage = reinterpret_cast<ze_image_object_t*>( hImage )->handle;

        // forward to device-driver
        result = pfnGetMemoryPropertiesExp( hImage, pMemoryProperties );

        return result;
    }